

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::CommandRunner::ReadInvalidModule
          (CommandRunner *this,int line_number,string_view module_filename,ModuleType module_type,
          char *desc)

{
  Result RVar1;
  CommandRunner *this_00;
  bool bVar2;
  Ptr module;
  Errors errors;
  string header;
  Ptr local_88;
  Errors local_68;
  _Alloc_hider local_50;
  
  this_00 = (CommandRunner *)&stack0xffffffffffffffb0;
  wabt::StringPrintf_abi_cxx11_
            ((string *)this_00,"%s:%d: %s passed",(this->source_filename_)._M_dataplus._M_p,
             line_number,desc);
  if (module_type == Binary) {
    local_68.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ReadModule(&local_88,this,module_filename,&local_68);
    bVar2 = local_88.obj_ == (Module *)0x0;
    if (bVar2) {
      wabt::FormatErrorsToFile
                (&local_68,Binary,(LexerSourceLineFinder *)0x0,_stdout,
                 (string *)&stack0xffffffffffffffb0,Once,0x50);
    }
    RVar1.enum_ = (Enum)bVar2;
    if (local_88.obj_ != (Module *)0x0) {
      wabt::interp::Store::DeleteRoot(local_88.store_,local_88.root_index_);
      local_88.obj_ = (Module *)0x0;
      local_88.store_ = (Store *)0x0;
      local_88.root_index_ = 0;
    }
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_68);
  }
  else {
    if (module_type != Text) {
      abort();
    }
    RVar1 = ReadInvalidTextModule(this_00,module_filename,(string *)&stack0xffffffffffffffb0);
  }
  if (local_50._M_p != &stack0xffffffffffffffc0) {
    operator_delete(local_50._M_p);
  }
  return (Result)RVar1.enum_;
}

Assistant:

wabt::Result CommandRunner::ReadInvalidModule(int line_number,
                                        string_view module_filename,
                                        ModuleType module_type,
                                        const char* desc) {
  std::string header = StringPrintf(
      "%s:%d: %s passed", source_filename_.c_str(), line_number, desc);

  switch (module_type) {
    case ModuleType::Text: {
      return ReadInvalidTextModule(module_filename, header);
    }

    case ModuleType::Binary: {
      Errors errors;
      auto module = ReadModule(module_filename, &errors);
      if (!module) {
        FormatErrorsToFile(errors, Location::Type::Binary, {}, stdout, header,
                           PrintHeader::Once);
        return wabt::Result::Error;
      } else {
        return wabt::Result::Ok;
      }
    }
  }

  WABT_UNREACHABLE;
}